

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phase.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  undefined7 uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  size_t sVar8;
  long lVar10;
  string *psVar11;
  long lVar12;
  byte bVar13;
  initializer_list<double> __l;
  int fft_length;
  int num_denominator_order;
  int num_numerator_order;
  vector<double,_std::allocator<double>_> waveform;
  vector<double,_std::allocator<double>_> numerator_coefficients;
  vector<double,_std::allocator<double>_> denominator_coefficients;
  ifstream ifs_for_denominator;
  vector<double,_std::allocator<double>_> output;
  FilterCoefficientsToPhaseSpectrum filter_coefficients_to_phase_spectrum;
  ostringstream error_message;
  ostringstream error_message_7;
  Buffer buffer;
  int local_784;
  ulong local_780;
  int local_778;
  int local_774;
  string *local_770;
  ulong local_768;
  string local_760;
  char *local_740;
  undefined8 local_738;
  string *local_730;
  vector<double,_std::allocator<double>_> local_728;
  vector<double,_std::allocator<double>_> local_710;
  string local_6f8;
  byte abStack_6d8 [80];
  ios_base local_688 [408];
  vector<double,_std::allocator<double>_> local_4f0;
  undefined1 local_4d8 [24];
  RealValuedFastFourierTransform local_4c0;
  bool local_458;
  string local_450;
  byte abStack_430 [80];
  ios_base local_3e0 [408];
  undefined1 local_248 [376];
  undefined1 local_d0 [128];
  bool local_50;
  
  local_784 = 0x100;
  local_774 = 0;
  local_738 = 0;
  local_778 = 0;
  psVar11 = &local_450;
  local_780 = 0;
  local_768 = 0;
  local_770 = (string *)0x0;
  local_740 = (char *)0x0;
LAB_001037b0:
  while (iVar6 = ya_getopt_long(argc,argv,"l:m:n:z:p:uh",(option *)0x0,(int *)0x0), iVar6 == 0x6c) {
    std::__cxx11::string::string((string *)psVar11,ya_optarg,(allocator *)&local_6f8);
    bVar3 = sptk::ConvertStringToInteger(psVar11,&local_784);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"The argument for the -l option must be an integer",0x31);
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
      sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
LAB_00103b16:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_450);
      std::ios_base::~ios_base(local_3e0);
      return 1;
    }
  }
  if (iVar6 < 0x6d) {
    if (iVar6 == -1) {
      bVar3 = sptk::SetBinaryMode();
      uVar2 = local_768;
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_450,"Cannot set translation mode",0x1b);
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
        sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
        goto LAB_00103b16;
      }
      bVar13 = (byte)local_768;
      if (((local_768 & 1) == 0) && ((local_780 & 1) == 0)) {
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_450,"Too many input files",0x14);
          local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
          sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
          goto LAB_00103b16;
        }
        if (argc == ya_optind) {
          std::ifstream::ifstream(&local_450);
        }
        else {
          pcVar1 = argv[ya_optind];
          std::ifstream::ifstream(&local_450);
          if ((pcVar1 != (char *)0x0) &&
             (std::ifstream::open((char *)&local_450,(_Ios_Openmode)pcVar1),
             (abStack_430[*(long *)(local_450._M_dataplus._M_p + -0x18)] & 5) != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_6f8,"Cannot open file ",0x11);
            sVar8 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_6f8,pcVar1,sVar8);
            local_248._0_8_ = local_248 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"phase","");
            sptk::PrintErrorMessage((string *)local_248,(ostringstream *)&local_6f8);
            if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
              operator_delete((void *)local_248._0_8_);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6f8);
            std::ios_base::~ios_base(local_688);
            std::ifstream::~ifstream(&local_450);
            return 1;
          }
        }
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') {
          psVar11 = (string *)&std::cin;
        }
        sptk::FilterCoefficientsToPhaseSpectrum::FilterCoefficientsToPhaseSpectrum
                  ((FilterCoefficientsToPhaseSpectrum *)local_d0,local_784 + -1,0,local_784,
                   (bool)((byte)local_738 & 1));
        local_248._0_8_ = &PTR__Buffer_00112c08;
        local_248._8_8_ = &PTR__Buffer_00112c38;
        memset(local_248 + 0x10,0,0x90);
        iVar6 = local_784;
        if (local_50 != false) {
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&local_760,(long)local_784,
                     (allocator_type *)&local_6f8);
          iVar6 = iVar6 / 2 + 1;
          local_780 = CONCAT44(local_780._4_4_,iVar6);
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_728,(long)iVar6,(allocator_type *)&local_6f8);
          goto LAB_001043eb;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_6f8,"Failed to initialize FilterCoefficientsToPhaseSpectrum",
                   0x36);
        local_4d8._0_8_ = local_4d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"phase","");
        sptk::PrintErrorMessage((string *)local_4d8,(ostringstream *)&local_6f8);
        if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
          operator_delete((void *)local_4d8._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6f8);
        std::ios_base::~ios_base(local_688);
        iVar6 = 1;
        bVar3 = false;
        goto LAB_00104793;
      }
      lVar10 = (long)local_774;
      lVar12 = (long)local_778;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_728,lVar10 + 1U,(allocator_type *)&local_450);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_710,lVar12 + 1U,(allocator_type *)&local_450);
      if ((((uVar2 & 1) == 0) || ((local_780 & 1) == 0)) ||
         (local_770 != (string *)0x0 && local_740 != (char *)0x0)) {
        if (argc <= ya_optind) {
          local_730 = &local_450;
          std::ifstream::ifstream(local_730);
          pcVar1 = local_740;
          if ((local_740 != (char *)0x0 & bVar13) == 1) {
            std::ifstream::open((char *)&local_450,(_Ios_Openmode)local_740);
            if ((abStack_430[*(long *)(local_450._M_dataplus._M_p + -0x18)] & 5) != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_6f8,"Cannot open file ",0x11);
              sVar8 = strlen(pcVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_6f8,pcVar1,sVar8)
              ;
              local_248._0_8_ = local_248 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"phase","");
              sptk::PrintErrorMessage((string *)local_248,(ostringstream *)&local_6f8);
              if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                operator_delete((void *)local_248._0_8_);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6f8);
              std::ios_base::~ios_base(local_688);
              iVar6 = 1;
              bVar3 = false;
              goto LAB_00104694;
            }
          }
          else {
            *local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = 1.0;
          }
          psVar11 = local_770;
          cVar4 = std::__basic_file<char>::is_open();
          if (cVar4 == '\0') {
            local_730 = (string *)&std::cin;
          }
          local_770 = &local_6f8;
          std::ifstream::ifstream(local_770);
          if ((psVar11 != (string *)0x0 & (byte)local_780) == 1) {
            std::ifstream::open((char *)&local_6f8,(_Ios_Openmode)psVar11);
            if ((abStack_6d8[*(long *)(local_6f8._M_dataplus._M_p + -0x18)] & 5) != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_248,"Cannot open file ",0x11);
              sVar8 = strlen((char *)psVar11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_248,(char *)psVar11,sVar8);
              local_d0._0_8_ = local_d0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"phase","");
              sptk::PrintErrorMessage((string *)local_d0,(ostringstream *)local_248);
              if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
                operator_delete((void *)local_d0._0_8_);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
              std::ios_base::~ios_base((ios_base *)(local_248 + 0x70));
              iVar6 = 1;
              bVar3 = false;
              goto LAB_00104687;
            }
          }
          else {
            *local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = 1.0;
          }
          cVar4 = std::__basic_file<char>::is_open();
          if (cVar4 == '\0') {
            local_770 = (string *)&std::cin;
          }
          sptk::FilterCoefficientsToPhaseSpectrum::FilterCoefficientsToPhaseSpectrum
                    ((FilterCoefficientsToPhaseSpectrum *)local_4d8,local_774,local_778,local_784,
                     (bool)((byte)local_738 & 1));
          local_d0._0_8_ = &PTR__Buffer_00112c08;
          local_d0._8_8_ = &PTR__Buffer_00112c38;
          memset(local_d0 + 0x10,0,0x90);
          if (local_458 != false) {
            iVar6 = local_784 / 2 + 1;
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_4f0,(long)iVar6,(allocator_type *)local_248);
            goto LAB_00103fcc;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_248,"Failed to initialize FilterCoefficientsToPhaseSpectrum",
                     0x36);
          local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"phase","");
          sptk::PrintErrorMessage(&local_760,(ostringstream *)local_248);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_760._M_dataplus._M_p != &local_760.field_2) {
            operator_delete(local_760._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
          std::ios_base::~ios_base((ios_base *)(local_248 + 0x70));
          iVar6 = 1;
          bVar3 = false;
          goto LAB_00104662;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_450,"Too many input files",0x14);
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
        sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_450,"Numerator and denominator coefficient files are required",
                   0x38);
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
        sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_450);
      std::ios_base::~ios_base(local_3e0);
      iVar6 = 1;
      bVar3 = false;
      goto LAB_001046a1;
    }
    if (iVar6 == 0x68) {
      anon_unknown.dwarf_2f28::PrintUsage((ostream *)&std::cout);
      goto LAB_00103943;
    }
  }
  else {
    uVar9 = (undefined7)((ulong)ya_optarg >> 8);
    if (iVar6 - 0x6dU < 9) {
      switch(iVar6) {
      case 0x6d:
        std::__cxx11::string::string((string *)psVar11,ya_optarg,(allocator *)&local_6f8);
        bVar3 = sptk::ConvertStringToInteger(psVar11,&local_774);
        paVar7 = &local_450.field_2;
        bVar13 = -1 < local_774;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != paVar7) {
          local_768 = CONCAT71(local_768._1_7_,-1 < local_774);
          operator_delete(local_450._M_dataplus._M_p);
          paVar7 = extraout_RAX;
          bVar13 = (byte)local_768;
        }
        local_768 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
        if ((bVar3 & bVar13) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_450,
                     "The argument for the -m option must be a non-negative integer",0x3d);
          local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
          sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
          goto LAB_00103b16;
        }
        goto LAB_001037b0;
      case 0x6e:
        std::__cxx11::string::string((string *)psVar11,ya_optarg,(allocator *)&local_6f8);
        bVar3 = sptk::ConvertStringToInteger(psVar11,&local_778);
        paVar7 = &local_450.field_2;
        bVar13 = -1 < local_778;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != paVar7) {
          local_780 = CONCAT71(local_780._1_7_,-1 < local_778);
          operator_delete(local_450._M_dataplus._M_p);
          paVar7 = extraout_RAX_00;
          bVar13 = (byte)local_780;
        }
        local_780 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
        if ((bVar3 & bVar13) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_450,
                     "The argument for the -n option must be a non-negative integer",0x3d);
          local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"phase","");
          sptk::PrintErrorMessage(&local_6f8,(ostringstream *)&local_450);
          goto LAB_00103b16;
        }
        goto LAB_001037b0;
      case 0x70:
        local_770 = (string *)ya_optarg;
        local_780 = CONCAT71(uVar9,1);
        goto LAB_001037b0;
      case 0x75:
        local_738 = CONCAT71((int7)((ulong)((long)&switchD_0010382a::switchdataD_0010d004 +
                                           (long)(int)(&switchD_0010382a::switchdataD_0010d004)
                                                      [iVar6 - 0x6dU]) >> 8),1);
        goto LAB_001037b0;
      }
    }
    else if (iVar6 == 0x7a) {
      local_740 = ya_optarg;
      local_768 = CONCAT71(uVar9,1);
      goto LAB_001037b0;
    }
  }
  anon_unknown.dwarf_2f28::PrintUsage((ostream *)&std::cerr);
  return 1;
  while( true ) {
    bVar5 = sptk::WriteStream<double>(0,(int)local_780,&local_728,(ostream *)&std::cout,(int *)0x0);
    if (!bVar5) break;
LAB_001043eb:
    bVar3 = sptk::ReadStream<double>
                      (true,0,0,local_784,(vector<double,_std::allocator<double>_> *)&local_760,
                       (istream *)psVar11,(int *)0x0);
    if (!bVar3) {
      iVar6 = 0;
      goto LAB_00104771;
    }
    local_4d8._0_8_ = (_func_int **)0x3ff0000000000000;
    __l._M_len = 1;
    __l._M_array = (iterator)local_4d8;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_6f8,__l,
               (allocator_type *)&local_710);
    bVar5 = sptk::FilterCoefficientsToPhaseSpectrum::Run
                      ((FilterCoefficientsToPhaseSpectrum *)local_d0,
                       (vector<double,_std::allocator<double>_> *)&local_760,
                       (vector<double,_std::allocator<double>_> *)&local_6f8,&local_728,
                       (Buffer *)local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_6f8._M_dataplus._M_p);
    }
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_6f8,"Failed to transform waveform to phase",0x25);
      local_4d8._0_8_ = local_4d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"phase","");
      sptk::PrintErrorMessage((string *)local_4d8,(ostringstream *)&local_6f8);
      goto LAB_00104739;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_6f8,"Failed to write phase",0x15);
  local_4d8._0_8_ = local_4d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"phase","");
  sptk::PrintErrorMessage((string *)local_4d8,(ostringstream *)&local_6f8);
LAB_00104739:
  if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6f8);
  std::ios_base::~ios_base(local_688);
  iVar6 = 1;
LAB_00104771:
  if (local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_760._M_dataplus._M_p);
  }
  bVar3 = !bVar3;
LAB_00104793:
  sptk::FilterCoefficientsToPhaseSpectrum::Buffer::~Buffer((Buffer *)local_248);
  local_d0._0_8_ = &PTR__FilterCoefficientsToPhaseSpectrum_00112c68;
  sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
            ((RealValuedFastFourierTransform *)(local_d0 + 0x18));
  std::ifstream::~ifstream(&local_450);
  goto LAB_001046c2;
  while( true ) {
    bVar3 = sptk::FilterCoefficientsToPhaseSpectrum::Run
                      ((FilterCoefficientsToPhaseSpectrum *)local_4d8,&local_728,&local_710,
                       &local_4f0,(Buffer *)local_d0);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_248,"Failed to transform filter coefficients to phase",0x30);
      local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"phase","");
      sptk::PrintErrorMessage(&local_760,(ostringstream *)local_248);
      goto LAB_00104619;
    }
    bVar3 = sptk::WriteStream<double>(0,iVar6,&local_4f0,(ostream *)&std::cout,(int *)0x0);
    if (!bVar3) break;
LAB_00103fcc:
    if ((((local_768 & 1) != 0) &&
        (bVar3 = sptk::ReadStream<double>
                           (false,0,0,(int)(lVar10 + 1U),&local_728,(istream *)local_730,(int *)0x0)
        , !bVar3)) ||
       (((local_780 & 1) != 0 &&
        (bVar3 = sptk::ReadStream<double>
                           (false,0,0,(int)(lVar12 + 1U),&local_710,(istream *)local_770,(int *)0x0)
        , !bVar3)))) {
      iVar6 = 0;
      bVar3 = true;
      goto LAB_00104650;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_248,"Failed to write phase",0x15);
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"phase","");
  sptk::PrintErrorMessage(&local_760,(ostringstream *)local_248);
LAB_00104619:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
  std::ios_base::~ios_base((ios_base *)(local_248 + 0x70));
  iVar6 = 1;
  bVar3 = false;
LAB_00104650:
  if (local_4f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00104662:
  sptk::FilterCoefficientsToPhaseSpectrum::Buffer::~Buffer((Buffer *)local_d0);
  local_4d8._0_8_ = &PTR__FilterCoefficientsToPhaseSpectrum_00112c68;
  sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform(&local_4c0);
LAB_00104687:
  std::ifstream::~ifstream(&local_6f8);
LAB_00104694:
  std::ifstream::~ifstream(&local_450);
LAB_001046a1:
  if (local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_728.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_001046c2:
  if (bVar3) {
LAB_00103943:
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_numerator_order(kDefaultNumNumeratorOrder);
  int num_denominator_order(kDefaultNumDenominatorOrder);
  const char* numerator_coefficients_file(NULL);
  const char* denominator_coefficients_file(NULL);
  bool is_numerator_specified(false);
  bool is_denominator_specified(false);
  bool unwrapping(kDefaultUnwrappingFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:n:z:p:uh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_numerator_order) ||
            num_numerator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        is_numerator_specified = true;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_denominator_order) ||
            num_denominator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -n option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        is_denominator_specified = true;
        break;
      }
      case 'z': {
        numerator_coefficients_file = optarg;
        is_numerator_specified = true;
        break;
      }
      case 'p': {
        denominator_coefficients_file = optarg;
        is_denominator_specified = true;
        break;
      }
      case 'u': {
        unwrapping = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("phase", error_message);
    return 1;
  }

  if (is_numerator_specified || is_denominator_specified) {
    const int numerator_length(num_numerator_order + 1);
    const int denominator_length(num_denominator_order + 1);
    std::vector<double> numerator_coefficients(numerator_length);
    std::vector<double> denominator_coefficients(denominator_length);

    if (is_numerator_specified && is_denominator_specified &&
        (NULL == numerator_coefficients_file ||
         NULL == denominator_coefficients_file)) {
      std::ostringstream error_message;
      error_message
          << "Numerator and denominator coefficient files are required";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int num_input_files(argc - optind);
    if (0 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    std::ifstream ifs_for_numerator;
    if (is_numerator_specified && NULL != numerator_coefficients_file) {
      ifs_for_numerator.open(numerator_coefficients_file,
                             std::ios::in | std::ios::binary);
      if (ifs_for_numerator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << numerator_coefficients_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    } else {
      numerator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_numerator(
        ifs_for_numerator.is_open() ? ifs_for_numerator : std::cin);

    std::ifstream ifs_for_denominator;
    if (is_denominator_specified && NULL != denominator_coefficients_file) {
      ifs_for_denominator.open(denominator_coefficients_file,
                               std::ios::in | std::ios::binary);
      if (ifs_for_denominator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << denominator_coefficients_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    } else {
      denominator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_denominator(
        ifs_for_denominator.is_open() ? ifs_for_denominator : std::cin);

    sptk::FilterCoefficientsToPhaseSpectrum
        filter_coefficients_to_phase_spectrum(
            num_numerator_order, num_denominator_order, fft_length, unwrapping);
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer buffer;
    if (!filter_coefficients_to_phase_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize FilterCoefficientsToPhaseSpectrum";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> output(output_length);
    while ((!is_numerator_specified ||
            sptk::ReadStream(false, 0, 0, numerator_length,
                             &numerator_coefficients,
                             &input_stream_for_numerator, NULL)) &&
           (!is_denominator_specified ||
            sptk::ReadStream(false, 0, 0, denominator_length,
                             &denominator_coefficients,
                             &input_stream_for_denominator, NULL))) {
      if (!filter_coefficients_to_phase_spectrum.Run(numerator_coefficients,
                                                     denominator_coefficients,
                                                     &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform filter coefficients to phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
  } else {
    const int num_input_files(argc - optind);
    if (1 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }
    const char* input_file(0 == num_input_files ? NULL : argv[optind]);

    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    sptk::FilterCoefficientsToPhaseSpectrum waveform_to_phase_spectrum(
        fft_length - 1, 0, fft_length, unwrapping);
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer buffer;
    if (!waveform_to_phase_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize FilterCoefficientsToPhaseSpectrum";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> waveform(fft_length);
    std::vector<double> output(output_length);
    while (sptk::ReadStream(true, 0, 0, fft_length, &waveform, &input_stream,
                            NULL)) {
      if (!waveform_to_phase_spectrum.Run(waveform, {1}, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
  }

  return 0;
}